

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_DifferentTypes_Test::TestBody
          (AnyTest_DifferentTypes_Test *this)

{
  bool bVar1;
  int iVar2;
  pointer *__ptr;
  char *message;
  char *in_R9;
  pointer *__ptr_2;
  string difference_string;
  ForeignMessage value2;
  TestAny m2;
  TestAny m1;
  TestField value1;
  MessageDifferencer message_differencer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_348;
  internal local_340 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  string local_330;
  AssertHelper local_310;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_308;
  string local_2f0;
  ForeignMessage local_2d0;
  TestAny local_2b0;
  TestAny local_268;
  TestField local_220;
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestField::TestField(&local_220,(Arena *)0x0);
  local_220.field_0._impl_.a_ = 0x14;
  local_220.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_220.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  proto2_unittest::ForeignMessage::ForeignMessage(&local_2d0,(Arena *)0x0);
  local_2d0.field_0._impl_.c_ = 0x1e;
  local_2d0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_2d0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  proto2_unittest::TestAny::TestAny(&local_268,(Arena *)0x0);
  proto2_unittest::TestAny::TestAny(&local_2b0,(Arena *)0x0);
  local_268.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_268.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  if (local_268.field_0._impl_.any_value_ == (Any *)0x0) {
    if ((local_268.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_268.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (local_268.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe
            );
    }
    local_268.field_0._impl_.any_value_ =
         (Any *)Arena::DefaultConstruct<google::protobuf::Any>
                          ((Arena *)local_268.super_Message.super_MessageLite._internal_metadata_.
                                    ptr_);
  }
  Any::PackFrom(local_268.field_0._impl_.any_value_,&local_220.super_Message);
  local_2b0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_2b0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  if (local_2b0.field_0._impl_.any_value_ == (Any *)0x0) {
    if ((local_2b0.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_2b0.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (local_2b0.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe
            );
    }
    local_2b0.field_0._impl_.any_value_ =
         (Any *)Arena::DefaultConstruct<google::protobuf::Any>
                          ((Arena *)local_2b0.super_Message.super_MessageLite._internal_metadata_.
                                    ptr_);
  }
  Any::PackFrom(local_2b0.field_0._impl_.any_value_,&local_2d0.super_Message);
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  local_2f0._M_string_length = 0;
  local_2f0.field_2._M_local_buf[0] = '\0';
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  util::MessageDifferencer::ReportDifferencesToString(&local_1c8,&local_2f0);
  bVar1 = util::MessageDifferencer::Compare
                    (&local_1c8,&local_268.super_Message,&local_2b0.super_Message);
  local_340[0] = (internal)!bVar1;
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_348);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_330,local_340,(AssertionResult *)"message_differencer.Compare(m1, m2)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x10c6,local_330._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,
                      CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                               local_330.field_2._M_local_buf[0]) + 1);
    }
    if (local_348._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_348._M_head_impl + 8))();
    }
    if (local_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_338,local_338);
    }
  }
  testing::ContainsRegex<char[81]>
            (&local_308,
             (StringLike<char[81]> *)
             "type_url: \".+/proto2_unittest.TestField\\\" -> \".+/proto2_unittest.ForeignMessage\""
            );
  if (local_308.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_330._M_dataplus._M_p =
         (pointer)local_308.impl_.regex_.
                  super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_330._M_string_length = 0;
    local_330.field_2._M_local_buf[0] = local_308.impl_.full_match_;
    goto LAB_00b96fd8;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_308.impl_.regex_.
     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count =
         (local_308.impl_.regex_.
          super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') {
      iVar2 = (local_308.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count;
      goto LAB_00b96fca;
    }
    LOCK();
    (local_308.impl_.regex_.
     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count =
         (local_308.impl_.regex_.
          super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    iVar2 = (local_308.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count + 1;
    (local_308.impl_.regex_.
     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = iVar2;
LAB_00b96fca:
    (local_308.impl_.regex_.
     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = iVar2 + 1;
  }
  local_330._M_string_length =
       (size_type)
       local_308.impl_.regex_.
       super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  local_330._M_dataplus._M_p =
       (pointer)local_308.impl_.regex_.
                super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_330.field_2._M_local_buf[0] = local_308.impl_.full_match_;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_308.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi);
LAB_00b96fd8:
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
  ::operator()(local_340,(char *)&local_330,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "difference_string");
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_330._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_330._M_string_length);
  }
  if (local_308.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_330);
    if (local_338 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_338->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x10cb,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if ((long *)local_330._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_330._M_dataplus._M_p + 8))();
    }
  }
  if (local_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_338,local_338);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,
                    CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                             local_2f0.field_2._M_local_buf[0]) + 1);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  proto2_unittest::TestAny::~TestAny(&local_2b0);
  proto2_unittest::TestAny::~TestAny(&local_268);
  proto2_unittest::ForeignMessage::~ForeignMessage(&local_2d0);
  proto2_unittest::TestField::~TestField(&local_220);
  return;
}

Assistant:

TEST(AnyTest, DifferentTypes) {
  proto2_unittest::TestField value1;
  value1.set_a(20);
  proto2_unittest::ForeignMessage value2;
  value2.set_c(30);

  proto2_unittest::TestAny m1, m2;
  m1.mutable_any_value()->PackFrom(value1);
  m2.mutable_any_value()->PackFrom(value2);
  util::MessageDifferencer message_differencer;
  std::string difference_string;
  message_differencer.ReportDifferencesToString(&difference_string);
  EXPECT_FALSE(message_differencer.Compare(m1, m2));
  // Any should be treated as a regular proto when the payload types differ.
  EXPECT_THAT(
      difference_string,
      testing::ContainsRegex(
          R"(type_url: ".+/proto2_unittest.TestField\" -> ".+/proto2_unittest.ForeignMessage")"));
}